

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.cpp
# Opt level: O2

int __thiscall SplayTree::remove(SplayTree *this,char *__filename)

{
  Node *__ptr;
  Node *pNVar1;
  Node *in_RDX;
  int value;
  
  if (in_RDX == (Node *)0x0) {
    pNVar1 = (Node *)0x0;
  }
  else {
    value = (int)__filename;
    __ptr = splay(this,value,in_RDX);
    pNVar1 = __ptr;
    if (__ptr->value == value) {
      if (__ptr->leftChild == (Node *)0x0) {
        pNVar1 = __ptr->rightChild;
      }
      else {
        pNVar1 = splay(this,value,__ptr->leftChild);
        pNVar1->rightChild = __ptr->rightChild;
      }
      free(__ptr);
    }
  }
  return (int)pNVar1;
}

Assistant:

SplayTree::Node *SplayTree::remove(int value, Node *root) {
    Node *temp;
    if (!root) {
        return nullptr;
    }
    root = splay(value, root);
    if (value != root->value) { // No such node in splay tree
        return root;
    } else {
        if (!root->leftChild) {
            temp = root;
            root = root->rightChild;
        } else {
            temp = root;
            /*Note: Since key == root->key, so after Splay(key, root->lChild),
              the tree we get will have no right child tree. (key > any key in
              root->lChild)*/
            root = splay(value, root->leftChild);
            root->rightChild = temp->rightChild;
        }
        free(temp);
        return root;
    }
}